

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLinearizeVisitor.cpp
# Opt level: O2

void __thiscall IRT::CLinearizeVisitor::CLinearizeVisitor(CLinearizeVisitor *this)

{
  CStatementList *pCVar1;
  CStatementList *this_00;
  
  (this->super_IVisitor)._vptr_IVisitor = (_func_int **)&PTR_Visit_0017ba78;
  (this->statementList)._M_t.
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl = (CStatementList *)0x0;
  this_00 = (CStatementList *)operator_new(0x20);
  CStatementList::CStatementList(this_00);
  pCVar1 = (this->statementList)._M_t.
           super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>.
           _M_t.
           super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
           super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl;
  (this->statementList)._M_t.
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl = this_00;
  if (pCVar1 != (CStatementList *)0x0) {
    (**(code **)((long)(pCVar1->super_CStatement).super_IStatement + 0x10))();
    return;
  }
  return;
}

Assistant:

IRT::CLinearizeVisitor::CLinearizeVisitor( ) {
    statementList = std::unique_ptr<CStatementList>( new CStatementList( ));
}